

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

ly_err_item * ly_err_last(ly_ctx *ctx)

{
  ly_ctx_err_rec *plVar1;
  ly_ctx *local_28;
  ly_ctx_err_rec *rec;
  ly_ctx *ctx_local;
  
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx","ly_err_last");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    plVar1 = ly_err_get_rec(ctx);
    if (plVar1 == (ly_ctx_err_rec *)0x0) {
      ctx_local = (ly_ctx *)0x0;
    }
    else {
      if (plVar1->err == (ly_err_item *)0x0) {
        local_28 = (ly_ctx *)0x0;
      }
      else {
        local_28 = (ly_ctx *)plVar1->err->prev;
      }
      ctx_local = local_28;
    }
  }
  return (ly_err_item *)ctx_local;
}

Assistant:

ly_err_item *
ly_err_last(const struct ly_ctx *ctx)
{
    struct ly_ctx_err_rec *rec;

    LY_CHECK_ARG_RET(NULL, ctx, NULL);

    /* get the pointer to the matching record */
    if (!(rec = ly_err_get_rec(ctx))) {
        return NULL;
    }

    return rec->err ? rec->err->prev : NULL;
}